

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O0

int __thiscall amrex::ParmParse::countval(ParmParse *this,char *name,int n)

{
  PP_entry *pPVar1;
  size_type sVar2;
  char *in_RSI;
  PP_entry *def;
  int local_b0;
  undefined7 in_stack_ffffffffffffff98;
  allocator in_stack_ffffffffffffff9f;
  ParmParse *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  Table *in_stack_ffffffffffffffb0;
  string local_40 [32];
  PP_entry *local_20;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffa0,in_RSI,(allocator *)&stack0xffffffffffffff9f);
  prefixedName(in_stack_ffffffffffffffa0,
               (string *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  pPVar1 = anon_unknown_12::ppindex
                     (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                      (string *)in_stack_ffffffffffffffa0,(bool)in_stack_ffffffffffffff9f);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9f);
  if (pPVar1 == (PP_entry *)0x0) {
    local_b0 = 0;
  }
  else {
    local_20 = pPVar1;
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&pPVar1->m_vals);
    local_b0 = (int)sVar2;
  }
  return local_b0;
}

Assistant:

int
ParmParse::countval (const char* name,
                     int         n) const
{
    //
    // First find n'th occurrence of name in table.
    //
    const PP_entry* def = ppindex(m_table, n, prefixedName(name), false);
    return def == 0 ? 0 : def->m_vals.size();
}